

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dcm-bias-estimation.cpp
# Opt level: O0

int testUnidimDcmBiasEstimator(int errorCode)

{
  allocator<double> *paVar1;
  double dVar2;
  size_type sVar3;
  reference pvVar4;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *pCVar5;
  ostream *this;
  void *this_00;
  double dVar6;
  value_type vVar7;
  double dVar8;
  double dVar9;
  int local_5cc;
  double dStack_5c8;
  int i_3;
  double error;
  double local_5b0;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_5a8;
  undefined1 local_588 [8];
  Vector6 log_k;
  UnidimLipmDcmEstimator local_548 [20];
  int local_534;
  undefined1 local_530 [4];
  int i_2;
  IndexedVectorArray log;
  UnidimLipmDcmEstimator est;
  double initbias;
  undefined1 local_168 [8];
  vector<double,_std::allocator<double>_> bias_hat;
  undefined1 local_148 [8];
  vector<double,_std::allocator<double>_> dcm_hat;
  int i_1;
  vector<double,_std::allocator<double>_> zmp_m;
  undefined1 local_108 [8];
  vector<double,_std::allocator<double>_> dcm_m;
  undefined1 local_e8 [8];
  vector<double,_std::allocator<double>_> dcm_m_unbiased;
  double dStack_c8;
  int i;
  double deviation;
  double initBiasstd;
  double lambda;
  undefined1 local_a8 [8];
  vector<double,_std::allocator<double>_> zmp;
  undefined1 local_88 [8];
  vector<double,_std::allocator<double>_> bias;
  allocator<double> local_59;
  undefined1 local_58 [8];
  vector<double,_std::allocator<double>_> dcm;
  int signallength;
  double dcmMeasurementErrorStd;
  double zmpMeasurementErrorStd;
  double biasDriftPerSecondStd;
  double dt;
  double w0;
  int errorCode_local;
  
  dVar6 = sqrt(10.88888888888889);
  dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 24000;
  std::allocator<double>::allocator(&local_59);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_58,24000,&local_59);
  std::allocator<double>::~allocator(&local_59);
  sVar3 = (size_type)
          dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  paVar1 = (allocator<double> *)
           ((long)&zmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_88,sVar3,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&zmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar3 = (size_type)
          dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  std::allocator<double>::allocator((allocator<double> *)((long)&lambda + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_a8,sVar3,
             (allocator<double> *)((long)&lambda + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&lambda + 7));
  vVar7 = (value_type)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(2.0,0.0);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_58,0);
  *pvVar4 = vVar7;
  vVar7 = (value_type)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.01,0.0)
  ;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_88,0);
  *pvVar4 = vVar7;
  dStack_c8 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.05,0.0)
  ;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_58,0);
  dVar9 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_a8,0);
  *pvVar4 = (2.0 / dVar6 + 1.0) * dVar9 + dStack_c8;
  for (dcm_m_unbiased.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      dcm_m_unbiased.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ <
      dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ + -1;
      dcm_m_unbiased.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           dcm_m_unbiased.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,
                        (long)dcm_m_unbiased.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    dVar9 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,
                        (long)dcm_m_unbiased.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    dVar8 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_a8,
                        (long)dcm_m_unbiased.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    dVar2 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,
                        (long)(dcm_m_unbiased.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1));
    *pvVar4 = dVar6 * 0.005 * (dVar8 - dVar2) + dVar9;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_88,
                        (long)dcm_m_unbiased.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    dVar9 = *pvVar4;
    dVar8 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                              (2.5e-05,0.0);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_88,
                        (long)(dcm_m_unbiased.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1));
    *pvVar4 = dVar9 + dVar8;
    dVar9 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.05,0.0);
    dStack_c8 = dStack_c8 + dVar9;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,
                        (long)dcm_m_unbiased.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    dVar9 = *pvVar4;
    dVar8 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.05,0.0);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_a8,
                        (long)(dcm_m_unbiased.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1));
    *pvVar4 = (2.0 / dVar6 + 1.0) * dVar9 + dVar8 + dStack_c8;
  }
  sVar3 = (size_type)
          dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  paVar1 = (allocator<double> *)
           ((long)&dcm_m.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_e8,sVar3,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&dcm_m.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar3 = (size_type)
          dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  paVar1 = (allocator<double> *)
           ((long)&zmp_m.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_108,sVar3,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&zmp_m.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar3 = (size_type)
          dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  paVar1 = (allocator<double> *)
           ((long)&dcm_hat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&i_1,sVar3,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&dcm_hat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  for (dcm_hat.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = 0;
      (int)dcm_hat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage <
      dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_;
      dcm_hat.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)dcm_hat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,
                        (long)(int)dcm_hat.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    dVar9 = *pvVar4;
    dVar8 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.005,0.0);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_e8,
                        (long)(int)dcm_hat.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    *pvVar4 = dVar9 + dVar8;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_e8,
                        (long)(int)dcm_hat.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    dVar9 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_88,
                        (long)(int)dcm_hat.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    dVar8 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_108,
                        (long)(int)dcm_hat.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    *pvVar4 = dVar9 + dVar8;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_a8,
                        (long)(int)dcm_hat.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    dVar9 = *pvVar4;
    dVar8 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.001,0.0);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i_1,
                        (long)(int)dcm_hat.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    *pvVar4 = dVar9 + dVar8;
  }
  sVar3 = (size_type)
          dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  paVar1 = (allocator<double> *)
           ((long)&bias_hat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_148,sVar3,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&bias_hat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar3 = (size_type)
          dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  std::allocator<double>::allocator((allocator<double> *)((long)&initbias + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_168,sVar3,
             (allocator<double> *)((long)&initbias + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&initbias + 7));
  stateObservation::UnidimLipmDcmEstimator::UnidimLipmDcmEstimator
            ((UnidimLipmDcmEstimator *)
             &log.v_.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,0.005,dVar6,0.002,0.0,0.0,0.0,0.01,
             0.005,0.01,0.01);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_108,0);
  dVar9 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)&i_1,0);
  stateObservation::UnidimLipmDcmEstimator::resetWithInputs
            (dVar9,*pvVar4,(bool)((char)&log + 'P'),0.005,0.001,0.0,0.01,0.01);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_530);
  for (local_534 = 1; w0._4_4_ = errorCode,
      local_534 <
      dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_534 = local_534 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_108,(long)local_534);
    dVar9 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i_1,(long)local_534);
    stateObservation::UnidimLipmDcmEstimator::setInputs(dVar9,*pvVar4);
    stateObservation::UnidimLipmDcmEstimator::update(local_548);
    vVar7 = (value_type)stateObservation::UnidimLipmDcmEstimator::getBias();
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_168,(long)local_534);
    *pvVar4 = vVar7;
    vVar7 = (value_type)stateObservation::UnidimLipmDcmEstimator::getUnbiasedDCM();
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_148,(long)local_534);
    *pvVar4 = vVar7;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_148,(long)local_534);
    dVar9 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_148,(long)local_534);
    if ((dVar9 != *pvVar4) || (NAN(dVar9) || NAN(*pvVar4))) goto LAB_00105404;
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_588);
    local_5b0 = (double)local_534;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator<<
              (&local_5a8,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_588,&local_5b0);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_168,(long)local_534);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                       (&local_5a8,pvVar4);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_88,(long)local_534);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                       (pCVar5,pvVar4);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_148,(long)local_534);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                       (pCVar5,pvVar4);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_e8,(long)local_534);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                       (pCVar5,pvVar4);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,(long)local_534);
    Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_(pCVar5,pvVar4);
    Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_5a8);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,6,1,0,6,1>>
              ((Matrix<double,_1,1,0,_1,1> *)&error,
               (EigenBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_588);
    stateObservation::
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::pushBack((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_530,(Matrix<double,__1,_1,_0,__1,_1> *)&error);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&error);
  }
  dStack_5c8 = 0.0;
  for (local_5cc = dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + -10;
      local_5cc <
      dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_5cc = local_5cc + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_148,(long)local_5cc);
    dVar9 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,(long)local_5cc);
    dVar6 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_168,(long)local_5cc);
    dVar8 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_88,(long)local_5cc);
    dStack_5c8 = ABS(dVar9 - dVar6) + ABS(dVar8 - *pvVar4) + dStack_5c8;
  }
  this = std::operator<<((ostream *)&std::cout,"Sum of error on the 10 last samples = ");
  this_00 = (void *)std::ostream::operator<<(this,dStack_5c8);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  if (dStack_5c8 <= 0.07) {
    w0._4_4_ = 0;
  }
LAB_00105404:
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_530);
  stateObservation::UnidimLipmDcmEstimator::~UnidimLipmDcmEstimator
            ((UnidimLipmDcmEstimator *)
             &log.v_.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_168);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_148);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&i_1);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_108);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_e8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_a8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_88);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_58);
  return w0._4_4_;
}

Assistant:

int testUnidimDcmBiasEstimator(int errorCode)
{
  double w0 = sqrt(cst::gravityConstant / 0.9);
  double dt = 0.005;

  double biasDriftPerSecondStd = 0.005;
  double zmpMeasurementErrorStd = 0.001;
  double dcmMeasurementErrorStd = 0.005;

  int signallength = int(120. / dt);

  ///////////////////////////////////////
  /// Build the ground truth signals
  ///////////////////////////////////////
  typedef tools::ProbabilityLawSimulation ran;
  std::vector<double> dcm(signallength), bias(signallength), zmp(signallength);

  /// set the desired exponential convergence of the DCM
  double lambda = 2;

  /// initialize the dcm and bias to a random value
  dcm[0] = ran::getGaussianScalar(2, 0);
  double initBiasstd = 0.01;

  bias[0] = ran::getGaussianScalar(0.01, 0);
  double deviation = ran::getGaussianScalar(0.05, 0);
  zmp[0] = (lambda / w0 + 1) * dcm[0] + deviation;

  for(int i = 0; i < signallength - 1; ++i)
  {
    /// dcm dynamics
    dcm[i + 1] = dcm[i] + dt * w0 * (dcm[i] - zmp[i]);
    /// drift
    bias[i + 1] = bias[i] + ran::getGaussianScalar(biasDriftPerSecondStd * dt);
    /// set a noisy zmp to create  bounded drift of the DCM
    deviation += ran::getGaussianScalar(0.05, 0);
    zmp[i + 1] = (lambda / w0 + 1) * dcm[i] + ran::getGaussianScalar(0.05, 0) + deviation;
  }

  /////////////////////////////////
  /// Build the measurements
  /////////////////////////////////
  std::vector<double> dcm_m_unbiased(signallength), dcm_m(signallength), zmp_m(signallength);

  for(int i = 0; i < signallength; ++i)
  {
    dcm_m_unbiased[i] = dcm[i] + ran::getGaussianScalar(dcmMeasurementErrorStd);
    dcm_m[i] = dcm_m_unbiased[i] + bias[i];
    zmp_m[i] = zmp[i] + ran::getGaussianScalar(zmpMeasurementErrorStd);
  }

  /////////////////////////////////
  /// Run the estimator
  /////////////////////////////////
  std::vector<double> dcm_hat(signallength), bias_hat(signallength);

  double initbias = 0;

  UnidimLipmDcmEstimator est(dt, w0);

  est.resetWithInputs(dcm_m[0], zmp_m[0], biasDriftPerSecondStd, dcmMeasurementErrorStd, zmpMeasurementErrorStd,
                      initbias, initBiasstd);

  IndexedVectorArray log;

  for(int i = 1; i < signallength; i++)
  {
    est.setInputs(dcm_m[i], zmp_m[i]);
    est.update();
    bias_hat[i] = est.getBias();
    dcm_hat[i] = est.getUnbiasedDCM();

    /// NaN detection
    if(dcm_hat[i] != dcm_hat[i])
    {
      return errorCode;
    }

    Vector6 log_k;

    log_k << i, bias_hat[i], bias[i], dcm_hat[i], dcm_m_unbiased[i], dcm[i];
    log.pushBack(log_k);
  }

  /// uncomment the following line to have a bit of a log
  // log.writeInFile("dcm.txt");

  /////////////////////////////////
  /// Check the rror
  /////////////////////////////////
  double error = 0;

  for(int i = signallength - 10; i < signallength; ++i)
  {
    error += fabs(dcm_hat[i] - dcm[i]) + fabs(bias_hat[i] - bias[i]);
  }

  std::cout << "Sum of error on the 10 last samples = " << error << std::endl;

  if(error > 0.07)
  {
    return errorCode;
  }
  else
  {
    return 0;
  }
}